

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O2

vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> * __thiscall
rr::VertexPacketAllocator::allocArray
          (vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *__return_storage_ptr__,
          VertexPacketAllocator *this,size_t count)

{
  VertexPacket *this_00;
  long lVar1;
  bool bVar2;
  deInt8 *ptr;
  VertexPacket *local_38;
  
  if (count == 0) {
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    lVar1 = 0x30;
    if (this->m_numberOfVertexOutputs != 0) {
      lVar1 = this->m_numberOfVertexOutputs * 0x10 + 0x20;
    }
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = (VertexPacket *)operator_new__(lVar1 * count);
    ptr = (deInt8 *)this_00;
    while (bVar2 = count != 0, count = count - 1, bVar2) {
      VertexPacket::VertexPacket(this_00);
      local_38 = this_00;
      std::vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>>::
      emplace_back<rr::VertexPacket*>
                ((vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>> *)
                 __return_storage_ptr__,&local_38);
      this_00 = (VertexPacket *)((long)(this_00->position).m_data + lVar1 + -8);
    }
    std::vector<signed_char_*,_std::allocator<signed_char_*>_>::push_back(&this->m_allocations,&ptr)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VertexPacket*> VertexPacketAllocator::allocArray (size_t count)
{
	if (!count)
		return std::vector<VertexPacket*>();

	const size_t extraVaryings	= (m_numberOfVertexOutputs == 0) ? (0) : (m_numberOfVertexOutputs-1);
	const size_t packetSize		= sizeof(VertexPacket) + extraVaryings * sizeof(GenericVec4);

	std::vector<VertexPacket*>	retVal;
	deInt8*						ptr = new deInt8[packetSize * count]; // throws bad_alloc => ok

	// *.push_back might throw bad_alloc
	try
	{
		// run ctors
		for (size_t i = 0; i < count; ++i)
			retVal.push_back(new (ptr + i*packetSize) VertexPacket()); // throws bad_alloc

		m_allocations.push_back(ptr); // throws bad_alloc
	}
	catch (std::bad_alloc& )
	{
		delete [] ptr;
		throw;
	}

	return retVal;
}